

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall
amrex::FabArrayBase::define
          (FabArrayBase *this,BoxArray *bxs,DistributionMapping *dm,int nvar,IntVect *ngrow)

{
  undefined4 in_ECX;
  BoxArray *in_RDI;
  undefined8 *in_R8;
  vector<bool,_std::allocator<bool>_> *in_stack_00000050;
  vector<bool,_std::allocator<bool>_> *in_stack_00000058;
  BoxArray *in_stack_ffffffffffffffb8;
  int local_34;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1000a62);
  std::vector<bool,_std::allocator<bool>_>::clear
            ((vector<bool,_std::allocator<bool>_> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  in_RDI[1].m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)*in_R8;
  *(undefined4 *)
   &in_RDI[1].m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = *(undefined4 *)(in_R8 + 1);
  *(undefined4 *)
   ((long)&in_RDI[1].m_simplified_list.
           super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4) =
       in_ECX;
  IntVect::IntVect((IntVect *)&local_34,0);
  *(ulong *)((long)&in_RDI[2].m_bat.m_op + 0xc) = CONCAT44(in_stack_ffffffffffffffd0,local_34);
  in_RDI[2].m_bat.m_op.m_bndryReg.m_loshft.vect[0] = in_stack_ffffffffffffffd4;
  BoxArray::operator=(in_RDI,in_stack_ffffffffffffffb8);
  DistributionMapping::operator=
            ((DistributionMapping *)in_RDI,(DistributionMapping *)in_stack_ffffffffffffffb8);
  DistributionMapping::getIndexArray
            ((DistributionMapping *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  Vector<int,_std::allocator<int>_>::operator=
            ((Vector<int,_std::allocator<int>_> *)in_RDI,
             (Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb8);
  DistributionMapping::getOwnerShip
            ((DistributionMapping *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  std::vector<bool,_std::allocator<bool>_>::operator=(in_stack_00000058,in_stack_00000050);
  return;
}

Assistant:

void
FabArrayBase::define (const BoxArray&            bxs,
                      const DistributionMapping& dm,
                      int                        nvar,
                      const IntVect&             ngrow)
{
    BL_ASSERT(ngrow.allGE(IntVect::TheZeroVector()));
    BL_ASSERT(boxarray.size() == 0);
    indexArray.clear();
    ownership.clear();
    n_grow = ngrow;
    n_comp = nvar;
    n_filled = IntVect(0);

    boxarray = bxs;

    BL_ASSERT(dm.ProcessorMap().size() == bxs.size());
    distributionMap = dm;

    indexArray = distributionMap.getIndexArray();
    ownership = distributionMap.getOwnerShip();
}